

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  FieldDescriptor *field;
  Message *this_00;
  Metadata MVar1;
  string_view name;
  LogMessageFatal LStack_28;
  
  MVar1 = Message::GetMetadata(options);
  name._M_str = "uninterpreted_option";
  name._M_len = 0x14;
  field = Descriptor::FindFieldByName(MVar1.descriptor,name);
  if (field != (FieldDescriptor *)0x0) {
    MVar1 = Message::GetMetadata(options);
    this_00 = Reflection::AddMessage(MVar1.reflection,options,field,(MessageFactory *)0x0);
    Message::CopyFrom(this_00,&uninterpreted_option->super_Message);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x263b,"field != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  ABSL_CHECK(field != nullptr);

  options->GetReflection()
      ->AddMessage(options, field)
      ->CopyFrom(uninterpreted_option);
}